

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.pb.h
# Opt level: O0

Duration * __thiscall google::protobuf::Duration::operator=(Duration *this,Duration *from)

{
  bool bVar1;
  Arena *lhs;
  Arena *rhs;
  Duration *from_local;
  Duration *this_local;
  
  if (this != from) {
    lhs = MessageLite::GetArena((MessageLite *)this);
    rhs = MessageLite::GetArena((MessageLite *)from);
    bVar1 = internal::CanMoveWithInternalSwap(lhs,rhs);
    if (bVar1) {
      InternalSwap(this,from);
    }
    else {
      CopyFrom(this,from);
    }
  }
  return this;
}

Assistant:

inline Duration& operator=(Duration&& from) noexcept {
    if (this == &from) return *this;
    if (::google::protobuf::internal::CanMoveWithInternalSwap(GetArena(), from.GetArena())) {
      InternalSwap(&from);
    } else {
      CopyFrom(from);
    }
    return *this;
  }